

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall Equality_modelHH_Test::Equality_modelHH_Test(Equality_modelHH_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012e8f8;
  return;
}

Assistant:

TEST(Equality, modelHH)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto clonedModel = model->clone();

    EXPECT_TRUE(model->equals(clonedModel));
    EXPECT_TRUE(clonedModel->equals(model));
}